

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O0

int archive_read_support_filter_lzip(archive *_a)

{
  int iVar1;
  archive_read *in_RDI;
  int magic_test;
  archive_read_filter_bidder *bidder;
  archive_read *a;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  archive_read_filter_bidder **in_stack_ffffffffffffffe0;
  int local_4;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar1 == -0x1e) {
    local_4 = -0x1e;
  }
  else {
    iVar1 = __archive_read_get_bidder(in_RDI,in_stack_ffffffffffffffe0);
    if (iVar1 == 0) {
      *in_stack_ffffffffffffffe0 = (archive_read_filter_bidder *)0x0;
      in_stack_ffffffffffffffe0[1] = (archive_read_filter_bidder *)0x1b8d7b;
      in_stack_ffffffffffffffe0[2] = (archive_read_filter_bidder *)lzip_bidder_bid;
      in_stack_ffffffffffffffe0[3] = (archive_read_filter_bidder *)lzip_bidder_init;
      in_stack_ffffffffffffffe0[4] = (archive_read_filter_bidder *)0x0;
      in_stack_ffffffffffffffe0[5] = (archive_read_filter_bidder *)0x0;
      local_4 = 0;
    }
    else {
      local_4 = -0x1e;
    }
  }
  return local_4;
}

Assistant:

int
archive_read_support_filter_lzip(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter_bidder *bidder;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_filter_lzip");

	if (__archive_read_get_bidder(a, &bidder) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	bidder->data = NULL;
	bidder->name = "lzip";
	bidder->bid = lzip_bidder_bid;
	bidder->init = lzip_bidder_init;
	bidder->options = NULL;
	bidder->free = NULL;
#if HAVE_LZMA_H && HAVE_LIBLZMA
	return (ARCHIVE_OK);
#else
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external lzip program for lzip decompression");
	return (ARCHIVE_WARN);
#endif
}